

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::CPPversion(TPpContext *this,TPpToken *ppToken)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int profileAtom;
  int line;
  int versionNumber;
  int token;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  iVar4 = scanToken(this,ppToken);
  if (((this->errorOnVersion & 1U) != 0) || ((this->versionSeen & 1U) != 0)) {
    bVar3 = TParseVersions::isReadingHLSL(&this->parseContext->super_TParseVersions);
    if (bVar3) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"invalid preprocessor command","#version","");
    }
    else {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"must occur first in shader","#version","");
    }
  }
  this->versionSeen = true;
  if (iVar4 == 10) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"must be followed by version number","#version","");
    this_local._4_4_ = 10;
  }
  else {
    if (iVar4 != 0x98) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"must be followed by version number","#version","");
    }
    iVar4 = atoi(ppToken->name);
    (ppToken->field_3).ival = iVar4;
    uVar1 = (ppToken->field_3).ival;
    uVar2 = (ppToken->loc).line;
    iVar4 = scanToken(this,ppToken);
    if (iVar4 == 10) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3c])
                (this->parseContext,(ulong)uVar2,(ulong)uVar1,0);
      this_local._4_4_ = 10;
    }
    else {
      iVar4 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
      if (((iVar4 != 0xaf) && (iVar4 != 0xb0)) && (iVar4 != 0xb1)) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"bad profile name; use es, core, or compatibility",
                   "#version","");
      }
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x3c])
                (this->parseContext,(ulong)uVar2,(ulong)uVar1,ppToken->name);
      this_local._4_4_ = scanToken(this,ppToken);
      if (this_local._4_4_ != 10) {
        (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (this->parseContext,ppToken,"bad tokens following profile -- expected newline",
                   "#version","");
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::CPPversion(TPpToken* ppToken)
{
    int token = scanToken(ppToken);

    if (errorOnVersion || versionSeen) {
        if (parseContext.isReadingHLSL())
            parseContext.ppError(ppToken->loc, "invalid preprocessor command", "#version", "");
        else
            parseContext.ppError(ppToken->loc, "must occur first in shader", "#version", "");
    }
    versionSeen = true;

    if (token == '\n') {
        parseContext.ppError(ppToken->loc, "must be followed by version number", "#version", "");

        return token;
    }

    if (token != PpAtomConstInt)
        parseContext.ppError(ppToken->loc, "must be followed by version number", "#version", "");

    ppToken->ival = atoi(ppToken->name);
    int versionNumber = ppToken->ival;
    int line = ppToken->loc.line;
    token = scanToken(ppToken);

    if (token == '\n') {
        parseContext.notifyVersion(line, versionNumber, nullptr);
        return token;
    } else {
        int profileAtom = atomStrings.getAtom(ppToken->name);
        if (profileAtom != PpAtomCore &&
            profileAtom != PpAtomCompatibility &&
            profileAtom != PpAtomEs)
            parseContext.ppError(ppToken->loc, "bad profile name; use es, core, or compatibility", "#version", "");
        parseContext.notifyVersion(line, versionNumber, ppToken->name);
        token = scanToken(ppToken);

        if (token == '\n')
            return token;
        else
            parseContext.ppError(ppToken->loc, "bad tokens following profile -- expected newline", "#version", "");
    }

    return token;
}